

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O1

transition_table_type<afsm::test::b::event_ab> *
afsm::transitions::
state_transition_table<afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,afsm::test::b::dummy_sm>,afsm::test::b::inner_dispatch_test,unsigned_long>
::transition_table<afsm::test::b::event_ab,0ul,1ul,2ul>(indexes_tuple<0UL,_1UL,_2UL> *param_1)

{
  if (transition_table<afsm::test::b::event_ab,0ul,1ul,2ul>(psst::meta::indexes_tuple<0ul,1ul,2ul>const&)
      ::_table == '\0') {
    transition_table<afsm::test::b::event_ab,0ul,1ul,2ul>();
  }
  return &state_transition_table<afsm::inner_state_machine<afsm::test::b::inner_dispatch_test,_afsm::test::b::dummy_sm>,_afsm::test::b::inner_dispatch_test,_unsigned_long>
          ::transition_table<afsm::test::b::event_ab,_0UL,_1UL,_2UL>::_table;
}

Assistant:

static transition_table_type< Event > const&
    transition_table( ::psst::meta::indexes_tuple< Indexes... > const& )
    {
        using event_type = typename ::std::decay<Event>::type;
        using event_transitions = typename ::psst::meta::find_if<
                def::handles_event< event_type >::template type, transitions_tuple >::type;
        static transition_table_type< Event > _table {{
            typename detail::transition_action_selector< fsm_type, this_type,
                typename ::psst::meta::find_if<
                    def::originates_from<
                        typename inner_states_def::template type< Indexes >
                    >::template type,
                    event_transitions
                >::type >::type{} ...
        }};
        return _table;
    }